

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsMotor::ChShaftsMotor(ChShaftsMotor *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  
  ChShaftsMotorBase::ChShaftsMotorBase(&this->super_ChShaftsMotorBase);
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotor_0116ed10;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = 0.0;
  auVar1 = ZEXT416(0) << 0x40;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  this->motor_set_rot_dt = 0.0;
  this->motor_torque = (double)auVar1._0_8_;
  this->motor_set_rot = (double)auVar1._8_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)auVar1._0_8_;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)auVar1._8_8_;
  auVar2 = ZEXT464(0) << 0x40;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_01186d30;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar2._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar2._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar2._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar2._48_16_;
  this->motor_mode = MOT_MODE_TORQUE;
  return;
}

Assistant:

ChShaftsMotor::ChShaftsMotor() : motor_torque(0), motor_set_rot(0), motor_set_rot_dt(0), motor_mode(MOT_MODE_TORQUE) {}